

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

EventTriggerStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::EventTriggerStatementSyntax,slang::syntax::SyntaxKind_const&,slang::syntax::NamedLabelSyntax*,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::syntax::TimingControlSyntax*,slang::syntax::NameSyntax&,slang::parsing::Token>
          (BumpAllocator *this,SyntaxKind *args,NamedLabelSyntax **args_1,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_2,Token *args_3,
          TimingControlSyntax **args_4,NameSyntax *args_5,Token *args_6)

{
  Token trigger;
  Token semi;
  EventTriggerStatementSyntax *this_00;
  
  this_00 = (EventTriggerStatementSyntax *)allocate(this,0x88,8);
  trigger.kind = args_3->kind;
  trigger._2_1_ = args_3->field_0x2;
  trigger.numFlags.raw = (args_3->numFlags).raw;
  trigger.rawLen = args_3->rawLen;
  trigger.info = args_3->info;
  semi.kind = args_6->kind;
  semi._2_1_ = args_6->field_0x2;
  semi.numFlags.raw = (args_6->numFlags).raw;
  semi.rawLen = args_6->rawLen;
  semi.info = args_6->info;
  slang::syntax::EventTriggerStatementSyntax::EventTriggerStatementSyntax
            (this_00,*args,*args_1,args_2,trigger,*args_4,args_5,semi);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }